

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::SendPetition(CommissionerImpl *this,PetitionHandler *aHandler)

{
  bool bVar1;
  uint uVar2;
  Error *pEVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  Error local_428;
  ErrorCode local_400;
  anon_class_1_0_00000001 local_3fa;
  v10 local_3f9;
  v10 *local_3f8;
  size_t local_3f0;
  string local_3e8;
  allocator local_3c1;
  string local_3c0;
  ResponseHandler local_3a0;
  ErrorCode local_37c;
  Error local_378;
  ErrorCode local_34c;
  Tlv local_348;
  Error local_328;
  ErrorCode local_300;
  allocator local_2f9;
  string local_2f8;
  Error local_2d8;
  anon_class_1_0_00000001 local_2aa;
  v10 local_2a9;
  v10 *local_2a8;
  size_t local_2a0;
  string local_298;
  Error local_278;
  undefined1 local_250 [8];
  anon_class_40_2_1bbb15e4 onResponse;
  undefined1 local_218 [8];
  Request request;
  Error error;
  PetitionHandler *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_140 [16];
  v10 *local_130;
  ulong local_128;
  v10 *local_120;
  size_t sStack_118;
  string *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_108 [2];
  undefined1 local_f8 [16];
  v10 *local_e8;
  ulong local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  v10 **local_80;
  v10 *local_78;
  size_t sStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  CommissionerImpl **local_40;
  undefined1 *local_38;
  CommissionerImpl **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  CommissionerImpl **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  Error::Error((Error *)&request.mEndpoint);
  coap::Message::Message((Message *)local_218,kConfirmable,kPost);
  local_250 = (undefined1  [8])this;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
              *)&onResponse,aHandler);
  if (this->mState == kConnected) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f8,"/c/cp",&local_2f9);
    coap::Message::SetUriPath(&local_2d8,(Message *)local_218,&local_2f8);
    pEVar3 = Error::operator=((Error *)&request.mEndpoint,&local_2d8);
    local_300 = kNone;
    bVar1 = commissioner::operator!=(pEVar3,&local_300);
    Error::~Error(&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    if (!bVar1) {
      tlv::Tlv::Tlv(&local_348,kCommissionerId,&(this->mConfig).mId,kMeshCoP);
      AppendTlv(&local_328,(Message *)local_218,&local_348);
      pEVar3 = Error::operator=((Error *)&request.mEndpoint,&local_328);
      local_34c = kNone;
      bVar1 = commissioner::operator!=(pEVar3,&local_34c);
      Error::~Error(&local_328);
      tlv::Tlv::~Tlv(&local_348);
      if (!bVar1) {
        uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
        if ((uVar2 & 1) != 0) {
          SignRequest(&local_378,this,(Request *)local_218,kMeshCoP,true);
          pEVar3 = Error::operator=((Error *)&request.mEndpoint,&local_378);
          local_37c = kNone;
          bVar1 = commissioner::operator!=(pEVar3,&local_37c);
          Error::~Error(&local_378);
          if (bVar1) goto LAB_0026559a;
        }
        this->mState = kPetitioning;
        std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
        function<ot::commissioner::CommissionerImpl::SendPetition(std::function<void(std::__cxx11::string_const*,ot::commissioner::Error)>)::__0&,void>
                  ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *
                   )&local_3a0,(anon_class_40_2_1bbb15e4 *)local_250);
        coap::CoapSecure::SendRequest(&this->mBrClient,(Request *)local_218,&local_3a0);
        std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
        ~function(&local_3a0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3c0,"meshcop",&local_3c1);
        SendPetition::anon_class_1_0_00000001::operator()(&local_3fa);
        local_a8 = &local_3f8;
        local_b0 = &local_3f9;
        bVar4 = ::fmt::v10::operator()(local_b0);
        local_3f0 = bVar4.size_;
        local_3f8 = (v10 *)bVar4.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_110 = &local_3e8;
        local_120 = local_3f8;
        sStack_118 = local_3f0;
        local_80 = &local_120;
        local_130 = local_3f8;
        local_128 = local_3f0;
        local_78 = local_130;
        sStack_70 = local_128;
        this_local = (CommissionerImpl *)
                     ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_38 = local_140;
        local_40 = &this_local;
        local_28 = 0;
        fmt_00.size_ = 0;
        fmt_00.data_ = (char *)local_128;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_40;
        local_30 = local_40;
        local_20 = local_38;
        local_18 = local_40;
        ::fmt::v10::vformat_abi_cxx11_(&local_3e8,local_130,fmt_00,args_00);
        Log(kDebug,&local_3c0,&local_3e8);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      }
    }
  }
  else {
    SendPetition::anon_class_1_0_00000001::operator()(&local_2aa);
    local_b8 = &local_2a8;
    local_c0 = &local_2a9;
    bVar4 = ::fmt::v10::operator()(local_c0);
    local_2a0 = bVar4.size_;
    local_2a8 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_c8 = &local_298;
    local_d8 = local_2a8;
    sStack_d0 = local_2a0;
    local_a0 = &local_d8;
    local_e8 = local_2a8;
    local_e0 = local_2a0;
    local_98 = local_e8;
    sStack_90 = local_e0;
    local_108[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_60 = local_f8;
    local_68 = local_108;
    local_50 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_e0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_68;
    local_58 = local_68;
    local_48 = local_60;
    local_10 = local_68;
    ::fmt::v10::vformat_abi_cxx11_(&local_298,local_e8,fmt,args);
    Error::Error(&local_278,kInvalidState,&local_298);
    Error::operator=((Error *)&request.mEndpoint,&local_278);
    Error::~Error(&local_278);
    std::__cxx11::string::~string((string *)&local_298);
  }
LAB_0026559a:
  local_400 = kNone;
  bVar1 = commissioner::operator!=((Error *)&request.mEndpoint,&local_400);
  if (bVar1) {
    Error::Error(&local_428,(Error *)&request.mEndpoint);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
    ::operator()(aHandler,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0,
                 &local_428);
    Error::~Error(&local_428);
  }
  SendPetition(std::function<void(std::__cxx11::string_const*,ot::commissioner::Error)>)::$_0::~__0
            ((__0 *)local_250);
  coap::Message::~Message((Message *)local_218);
  Error::~Error((Error *)&request.mEndpoint);
  return;
}

Assistant:

void CommissionerImpl::SendPetition(PetitionHandler aHandler)
{
    Error         error;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [this, aHandler](const coap::Response *aResponse, Error aError) {
        Error       error;
        tlv::TlvSet tlvSet;
        tlv::TlvPtr stateTlv          = nullptr;
        tlv::TlvPtr sessionIdTlv      = nullptr;
        tlv::TlvPtr commissionerIdTlv = nullptr;
        std::string existingCommissionerId;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

        SuccessOrExit(error = GetTlvSet(tlvSet, *aResponse));

        stateTlv = tlvSet[tlv::Type::kState];
        VerifyOrExit(stateTlv != nullptr, error = ERROR_BAD_FORMAT("no valid State TLV found in response"));
        if (stateTlv->GetValueAsInt8() != tlv::kStateAccept)
        {
            commissionerIdTlv = tlvSet[tlv::Type::kCommissionerId];
            if (commissionerIdTlv != nullptr && commissionerIdTlv->IsValid())
            {
                existingCommissionerId = commissionerIdTlv->GetValueAsString();
            }
            ExitNow(error = ERROR_REJECTED("petition was rejected"));
        }

        sessionIdTlv = tlvSet[tlv::Type::kCommissionerSessionId];
        VerifyOrExit(sessionIdTlv != nullptr,
                     error = ERROR_BAD_FORMAT("no valid Commissioner Session TLV found in response"));

        mSessionId = sessionIdTlv->GetValueAsUint16();
        mState     = State::kActive;
        mKeepAliveTimer.Start(GetKeepAliveInterval());

        LOG_INFO(LOG_REGION_MESHCOP, "petition succeed, start keep-alive timer with {} seconds",
                 GetKeepAliveInterval().count() / 1000);

    exit:
        if (error != ErrorCode::kNone)
        {
            mState = State::kDisabled;
        }
        aHandler(existingCommissionerId.empty() ? nullptr : &existingCommissionerId, error);
    };

    VerifyOrExit(mState == State::kConnected,
                 error = ERROR_INVALID_STATE("the commissioner is not started, petitioning, or already active"));
    SuccessOrExit(error = request.SetUriPath(uri::kPetitioning));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerId, mConfig.mId}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mState = State::kPetitioning;

    mBrClient.SendRequest(request, onResponse);

    LOG_DEBUG(LOG_REGION_MESHCOP, "sent petition request");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}